

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDnsServiceRecord>::emplace<QDnsServiceRecord_const&>
          (QMovableArrayOps<QDnsServiceRecord> *this,qsizetype i,QDnsServiceRecord *args)

{
  QDnsServiceRecord **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QDnsServiceRecord tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QDnsServiceRecord>).
           super_QArrayDataPointer<QDnsServiceRecord>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDnsServiceRecord>).super_QArrayDataPointer<QDnsServiceRecord>
        .size == i) {
      qVar5 = QArrayDataPointer<QDnsServiceRecord>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDnsServiceRecord> *)this);
      if (qVar5 == 0) goto LAB_002149d0;
      QDnsServiceRecord::QDnsServiceRecord
                ((this->super_QGenericArrayOps<QDnsServiceRecord>).
                 super_QArrayDataPointer<QDnsServiceRecord>.ptr +
                 (this->super_QGenericArrayOps<QDnsServiceRecord>).
                 super_QArrayDataPointer<QDnsServiceRecord>.size,args);
LAB_00214ab5:
      pqVar2 = &(this->super_QGenericArrayOps<QDnsServiceRecord>).
                super_QArrayDataPointer<QDnsServiceRecord>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00214a74;
    }
LAB_002149d0:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QDnsServiceRecord>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDnsServiceRecord> *)this);
      if (qVar5 != 0) {
        QDnsServiceRecord::QDnsServiceRecord
                  ((this->super_QGenericArrayOps<QDnsServiceRecord>).
                   super_QArrayDataPointer<QDnsServiceRecord>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QDnsServiceRecord>).
                   super_QArrayDataPointer<QDnsServiceRecord>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00214ab5;
      }
    }
  }
  tmp.d.d.ptr = (QSharedDataPointer<QDnsServiceRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QDnsServiceRecord::QDnsServiceRecord(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QDnsServiceRecord>).
          super_QArrayDataPointer<QDnsServiceRecord>.size != 0;
  QArrayDataPointer<QDnsServiceRecord>::detachAndGrow
            ((QArrayDataPointer<QDnsServiceRecord> *)this,(uint)(i == 0 && bVar6),1,
             (QDnsServiceRecord **)0x0,(QArrayDataPointer<QDnsServiceRecord> *)0x0);
  if (i == 0 && bVar6) {
    QDnsServiceRecord::QDnsServiceRecord
              ((this->super_QGenericArrayOps<QDnsServiceRecord>).
               super_QArrayDataPointer<QDnsServiceRecord>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QDnsServiceRecord>).
               super_QArrayDataPointer<QDnsServiceRecord>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDnsServiceRecord>).
              super_QArrayDataPointer<QDnsServiceRecord>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QDnsServiceRecord> *)this,i,1);
    QDnsServiceRecord::QDnsServiceRecord(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QDnsServiceRecord::~QDnsServiceRecord(&tmp);
LAB_00214a74:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }